

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O2

void * kj::Thread::runThread(void *ptr)

{
  Exception *exception;
  NullableValue<kj::Exception> _exception181;
  Own<kj::Function<void_()>::Iface,_std::nullptr_t> local_4e8;
  NullableValue<kj::Exception> local_4d0;
  NullableValue<kj::Exception> local_338;
  
  local_4e8.disposer = *ptr;
  local_4e8.ptr = *(Iface **)((long)ptr + 8);
  *(undefined8 *)((long)ptr + 8) = 0;
  Function<void_(kj::Function<void_()>)>::operator()
            ((Function<void_(kj::Function<void_()>)> *)((long)ptr + 0x10),
             (Function<void_()> *)&local_4e8);
  Own<kj::Function<void_()>::Iface,_std::nullptr_t>::dispose(&local_4e8);
  local_4d0.isSet = false;
  kj::_::NullableValue<kj::Exception>::NullableValue(&local_338,&local_4d0);
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_4d0);
  if (local_338.isSet == true) {
    kj::_::NullableValue<kj::Exception>::emplace<kj::Exception>
              ((NullableValue<kj::Exception> *)((long)ptr + 0x20),&local_338.field_1.value);
  }
  kj::_::NullableValue<kj::Exception>::~NullableValue(&local_338);
  ThreadState::unref((ThreadState *)ptr);
  return (void *)0x0;
}

Assistant:

void* Thread::runThread(void* ptr) {
#endif
  ThreadState* state = reinterpret_cast<ThreadState*>(ptr);
  KJ_IF_SOME(exception, kj::runCatchingExceptions([&]() {
    state->initializer(kj::mv(state->func));
  })) {
    state->exception = kj::mv(exception);
  }
  state->unref();
  return 0;
}